

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_miniscript_thresh(miniscript_node_t *node,miniscript_node_t *parent)

{
  byte *pbVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  miniscript_node_t *pmVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  miniscript_node_t *pmVar11;
  bool bVar12;
  
  pmVar11 = node->child;
  if (pmVar11 == (miniscript_node_t *)0x0) {
    return -2;
  }
  uVar6 = 0xffffffff;
  pmVar7 = pmVar11;
  do {
    pmVar7 = pmVar7->next;
    uVar6 = uVar6 + 1;
  } while (pmVar7 != (miniscript_node_t *)0x0);
  if (uVar6 < 3) {
    return -2;
  }
  if (pmVar11->info != (miniscript_item_t *)0x0) {
    return -2;
  }
  if (pmVar11->kind != 8) {
    return -2;
  }
  if (pmVar11->number < 0) {
    return -2;
  }
  uVar6 = (uint)pmVar11->number;
  if (uVar6 == 0) {
    return -2;
  }
  pmVar11 = pmVar11->next;
  if (pmVar11 == (miniscript_node_t *)0x0) {
    bVar2 = true;
    uVar9 = 0;
    bVar5 = 1;
    iVar10 = 0;
    uVar4 = 0;
  }
  else {
    bVar5 = 1;
    iVar8 = 0;
    uVar4 = 0;
    iVar10 = 0;
    bVar2 = true;
    do {
      if (pmVar11->info == (miniscript_item_t *)0x0) {
        return -2;
      }
      bVar12 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      if (bVar12) {
        uVar9 = ~pmVar11->type_properties & 0x1801;
      }
      else {
        uVar9 = ~pmVar11->type_properties & 0x1808;
      }
      if (uVar9 != 0) {
        return -2;
      }
      uVar9 = pmVar11->type_properties;
      if ((uVar9 >> 0xd & 1) == 0) {
        bVar2 = false;
      }
      if ((uVar9 >> 0x10 & 1) == 0) {
        bVar5 = 0;
      }
      uVar4 = uVar4 + ((uVar9 >> 0xf & 1) != 0);
      iVar10 = iVar10 + (2 - ((uVar9 >> 9 & 1) != 0) & (int)(uVar9 << 0x17) >> 0x1f);
      pmVar11 = pmVar11->next;
    } while (pmVar11 != (miniscript_node_t *)0x0);
    uVar9 = -iVar8;
  }
  if (uVar9 < uVar6) {
    return -2;
  }
  node->type_properties = 0x1801;
  if (iVar10 == 0) {
    uVar3 = 0x1901;
  }
  else {
    if (iVar10 != 1) goto LAB_001698e6;
    uVar3 = 0x1a01;
  }
  node->type_properties = uVar3;
LAB_001698e6:
  if ((bool)(uVar4 == uVar9 & bVar2)) {
    pbVar1 = (byte *)((long)&node->type_properties + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if ((bVar2) && ((bool)(bVar5 & uVar9 - uVar6 <= uVar4))) {
    pbVar1 = (byte *)((long)&node->type_properties + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((uVar9 - uVar6) + 1 <= uVar4) {
    pbVar1 = (byte *)((long)&node->type_properties + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return 0;
}

Assistant:

static int verify_miniscript_thresh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *top = NULL;
    struct miniscript_node_t *child = NULL;
    uint32_t count = 0;
    uint32_t k = 0;
    bool all_e = true;
    bool all_m = true;
    uint32_t args = 0;
    uint32_t num_s = 0;
    (void)parent;

    if (get_child_list_count(node) < 4)
        return WALLY_EINVAL;

    top = node->child;
    if (top->info || (top->kind != DESCRIPTOR_KIND_NUMBER) || (top->number < 0))
        return WALLY_EINVAL;

    k = (uint32_t) top->number;
    if (k < 1)
        return WALLY_EINVAL;

    child = top->next;
    while (child) {
        if (!child->info)
            return WALLY_EINVAL;

        if (!count) {
            if (~(child->type_properties) & (MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U))
                return WALLY_EINVAL;
        } else if (~(child->type_properties) & (MINISCRIPT_TYPE_W | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U))
            return WALLY_EINVAL;

        if (~(child->type_properties) & MINISCRIPT_PROPERTY_E)
            all_e = false;
        if (~(child->type_properties) & MINISCRIPT_PROPERTY_M)
            all_m = false;
        if ((child->type_properties) & MINISCRIPT_PROPERTY_S)
            ++num_s;
        if ((child->type_properties) & MINISCRIPT_PROPERTY_Z)
            args += (~(child->type_properties) & MINISCRIPT_PROPERTY_O) ? 2 : 1;

        ++count;
        child = child->next;
    }

    if (k > count)
        return WALLY_EINVAL;

    node->type_properties = MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U;
    if (args == 0)
        node->type_properties |= MINISCRIPT_PROPERTY_Z;
    else if (args == 1)
        node->type_properties |= MINISCRIPT_PROPERTY_O;
    if (all_e && num_s == count)
        node->type_properties |= MINISCRIPT_PROPERTY_E;
    if (all_e && all_m && num_s >= count - k)
        node->type_properties |= MINISCRIPT_PROPERTY_M;
    if (num_s >= count - k + 1)
        node->type_properties |= MINISCRIPT_PROPERTY_S;

    return WALLY_OK;
}